

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O0

TOKEN CNetTokenManager::GenerateToken(NETADDR *pAddr,int64 Seed)

{
  long lVar1;
  TOKEN TVar2;
  uint *in_RDI;
  long in_FS_OFFSET;
  uint Result;
  char aBuf [32];
  NETADDR Addr;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*in_RDI & 4) == 0) {
    mem_zero(in_RDI,in_stack_ffffffffffffff9c);
    mem_copy(in_RDI,(void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    mem_copy(in_RDI,(void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    mem_copy(in_RDI,(void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    TVar2 = Hash((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (int)((ulong)in_RDI >> 0x20));
    if (TVar2 == 0xffffffff) {
      TVar2 = 0xfffffffe;
    }
  }
  else {
    TVar2 = GenerateToken((NETADDR *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return TVar2;
}

Assistant:

TOKEN CNetTokenManager::GenerateToken(const NETADDR *pAddr, int64 Seed)
{
	static const NETADDR NullAddr = { 0 };
	NETADDR Addr;
	char aBuf[sizeof(NETADDR) + sizeof(int64)];
	unsigned int Result;

	if(pAddr->type & NETTYPE_LINK_BROADCAST)
		return GenerateToken(&NullAddr, Seed);

	mem_zero(&Addr, sizeof(NETADDR));
	mem_copy(Addr.ip, pAddr->ip, sizeof(Addr.ip));
	Addr.type = pAddr->type;

	mem_copy(aBuf, &Addr, sizeof(NETADDR));
	mem_copy(aBuf + sizeof(NETADDR), &Seed, sizeof(int64));

	Result = Hash(aBuf, sizeof(aBuf)) & NET_TOKEN_MASK;
	if(Result == NET_TOKEN_NONE)
		Result--;

	return Result;
}